

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::CallExpression::~CallExpression(CallExpression *this)

{
  bool bVar1;
  reference ppEVar2;
  Expr *arg;
  iterator __end2;
  iterator __begin2;
  vector<ast::Expr_*,_std::allocator<ast::Expr_*>_> *__range2;
  CallExpression *this_local;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__CallExpression_001e14b0;
  if (this->function != (Expr *)0x0) {
    (*(this->function->super_Node)._vptr_Node[1])();
  }
  this->function = (Expr *)0x0;
  __end2 = std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::begin(&this->arguments);
  arg = (Expr *)std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::end(&this->arguments);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ast::Expr_**,_std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>
                      (&__end2,(__normal_iterator<ast::Expr_**,_std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>
                                *)&arg);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<ast::Expr_**,_std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>
              ::operator*(&__end2);
    if (*ppEVar2 != (Expr *)0x0) {
      (*((*ppEVar2)->super_Node)._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<ast::Expr_**,_std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::
    operator++(&__end2);
  }
  std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::clear(&this->arguments);
  std::vector<ast::Expr_*,_std::allocator<ast::Expr_*>_>::~vector(&this->arguments);
  token::Token::~Token(&this->tok);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

~CallExpression(){
        delete function;
        function = nullptr;
        for(auto arg: arguments){
           delete  arg;
           arg = nullptr;
        }
        arguments.clear();
    }